

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::lowerTee(I64ToI32Lowering *this,LocalSet *curr)

{
  Index IVar1;
  Builder *pBVar2;
  LocalSet *any;
  Expression *pEVar3;
  LocalSet *append;
  Block *pBVar4;
  Block *local_78;
  undefined1 local_70 [8];
  TempVar highBits;
  TempVar tmp;
  
  fetchOutParam((TempVar *)local_70,this,curr->value);
  getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
  (curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 2;
  if ((char)tmp.pass != '\x01') {
    any = Builder::makeLocalSet
                    ((this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                     (Index)highBits.ty.id,(Expression *)curr);
    if ((char)highBits.pass != '\x01') {
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar1 = curr->index;
      pEVar3 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
      pEVar3->_id = LocalGetId;
      *(undefined4 *)(pEVar3 + 1) = local_70._0_4_;
      (pEVar3->type).id = 2;
      append = Builder::makeLocalSet(pBVar2,IVar1 + 1,pEVar3);
      if ((char)tmp.pass != '\x01') {
        pEVar3 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                             allocator,0x18,8);
        pEVar3->_id = LocalGetId;
        *(Index *)(pEVar3 + 1) = (Index)highBits.ty.id;
        (pEVar3->type).id = 2;
        pBVar2 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        pBVar4 = Builder::blockify(pBVar2,(Expression *)any,(Expression *)append);
        pBVar4 = Builder::blockify(pBVar2,(Expression *)pBVar4,pEVar3);
        Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                  (&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                    ).
                    super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                    .
                    super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                   ,(Expression *)pBVar4);
        local_78 = pBVar4;
        std::
        _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                  ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->highBitVars,&local_78,local_70);
        TempVar::~TempVar((TempVar *)&highBits.ty);
        TempVar::~TempVar((TempVar *)local_70);
        return;
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void lowerTee(LocalSet* curr) {
    TempVar highBits = fetchOutParam(curr->value);
    TempVar tmp = getTemp();
    curr->type = Type::i32;
    LocalSet* setLow = builder->makeLocalSet(tmp, curr);
    LocalSet* setHigh = builder->makeLocalSet(
      curr->index + 1, builder->makeLocalGet(highBits, Type::i32));
    LocalGet* getLow = builder->makeLocalGet(tmp, Type::i32);
    Block* result = builder->blockify(setLow, setHigh, getLow);
    replaceCurrent(result);
    setOutParam(result, std::move(highBits));
  }